

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.hpp
# Opt level: O2

void __thiscall
tl::Vector<glm::mat<4,_4,_float,_(glm::qualifier)0>_>::resize<>
          (Vector<glm::mat<4,_4,_float,_(glm::qualifier)0>_> *this,size_t size)

{
  undefined8 *puVar1;
  ulong uVar2;
  mat<4,_4,_float,_(glm::qualifier)0> *pmVar3;
  long lVar4;
  long lVar5;
  bool bVar6;
  
  if (this->_capacity < size) {
    grow(this,size);
  }
  uVar2 = this->_size;
  lVar5 = size - uVar2;
  if (uVar2 <= size && lVar5 != 0) {
    lVar4 = uVar2 << 6;
    while (bVar6 = lVar5 != 0, lVar5 = lVar5 + -1, bVar6) {
      pmVar3 = this->_data;
      puVar1 = (undefined8 *)((long)&pmVar3->value[3].field_0 + lVar4);
      *puVar1 = 0;
      puVar1[1] = 0;
      puVar1 = (undefined8 *)((long)&pmVar3->value[2].field_0 + lVar4);
      *puVar1 = 0;
      puVar1[1] = 0;
      puVar1 = (undefined8 *)((long)&pmVar3->value[1].field_0 + lVar4);
      *puVar1 = 0;
      puVar1[1] = 0;
      puVar1 = (undefined8 *)((long)&pmVar3->value[0].field_0 + lVar4);
      *puVar1 = 0;
      puVar1[1] = 0;
      lVar4 = lVar4 + 0x40;
    }
  }
  this->_size = size;
  return;
}

Assistant:

void Vector<T>::resize(size_t size, ConstructorArgs&&... args)noexcept
{
    if(size > _capacity)
        grow(size);
    if(size < _size) {
        for(size_t i = size; i < _size; i++) {
            _data[i].~T();
        }
    }
    else if(size > _size) {
        for(size_t i = _size; i < size; i++) {
            new (&_data[i]) T(tl::forward<ConstructorArgs>(args)...);
        }
    }
    _size = size;
}